

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_base64url_encode(char *target,char *data,int len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char cVar7;
  byte *pbVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  
  lVar10 = (long)len;
  iVar5 = len / 3;
  iVar11 = len % 3;
  iVar4 = (iVar5 + 1) - (uint)(iVar11 == 0);
  pcVar9 = target + (long)iVar4 * 4;
  *pcVar9 = '\0';
  if (iVar11 == 1) {
    uVar6 = (uint)data[lVar10 + -1];
    lVar10 = lVar10 + -2;
    pcVar9[-2] = '=';
    pcVar9[-1] = '=';
    cVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="[(uVar6 & 3) << 4];
  }
  else {
    if (iVar11 != 2) {
      pcVar9 = target + (long)iVar4 * 4 + -1;
      lVar10 = lVar10 + -1;
      goto LAB_00139f31;
    }
    cVar7 = data[lVar10 + -1];
    uVar6 = (uint)data[lVar10 + -2];
    lVar10 = lVar10 + -3;
    pcVar9[-1] = '=';
    pcVar9[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
                 [(ulong)((int)cVar7 & 0xf) * 4];
    cVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
            [(uint)(int)cVar7 >> 4 & 0xf | (uVar6 & 3) << 4];
  }
  pcVar9[-3] = cVar7;
  pcVar9[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
               [uVar6 >> 2 & 0x3f];
  pcVar9 = pcVar9 + -5;
LAB_00139f31:
  pbVar8 = (byte *)(data + lVar10);
  if (4 < len + 2U) {
    do {
      bVar1 = *pbVar8;
      bVar2 = pbVar8[-1];
      bVar3 = pbVar8[-2];
      *pcVar9 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="[bVar1 & 0x3f];
      pcVar9[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
                   [(uint)(bVar1 >> 6) + ((int)(char)bVar2 & 0xfU) * 4];
      pcVar9[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
                   [(uint)(int)(char)bVar2 >> 4 & 0xf | ((int)(char)bVar3 & 3U) << 4];
      pcVar9[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_="
                   [(uint)(int)(char)bVar3 >> 2 & 0x3f];
      pcVar9 = pcVar9 + -4;
      pbVar8 = pbVar8 + -3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return iVar4 * 4;
}

Assistant:

static inline int fio_base64_encode_internal(char *target, const char *data,
                                             int len,
                                             const char *base64_encodes) {
  /* walk backwards, allowing fo inplace decoding (target == data) */
  int groups = len / 3;
  const int mod = len - (groups * 3);
  const int target_size = (groups + (mod != 0)) * 4;
  char *writer = target + target_size - 1;
  const char *reader = data + len - 1;
  writer[1] = 0;
  switch (mod) {
  case 2: {
    char tmp2 = *(reader--);
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = base64_encodes[((tmp2 & 15) << 2)];
    *(writer--) = base64_encodes[((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15)];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  case 1: {
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = '=';
    *(writer--) = base64_encodes[(tmp1 & 3) << 4];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  }
  while (groups) {
    groups--;
    const char tmp3 = *(reader--);
    const char tmp2 = *(reader--);
    const char tmp1 = *(reader--);
    *(writer--) = base64_encodes[tmp3 & 63];
    *(writer--) = base64_encodes[((tmp2 & 15) << 2) | ((tmp3 >> 6) & 3)];
    *(writer--) = base64_encodes[(((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15))];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  }
  return target_size;
}